

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O2

void __thiscall ncnn::Net::~Net(Net *this)

{
  clear(this);
  std::_Vector_base<ncnn::layer_registry_entry,_std::allocator<ncnn::layer_registry_entry>_>::
  ~_Vector_base(&(this->custom_layer_registry).
                 super__Vector_base<ncnn::layer_registry_entry,_std::allocator<ncnn::layer_registry_entry>_>
               );
  std::_Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::~_Vector_base
            (&(this->layers).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>);
  std::vector<ncnn::Blob,_std::allocator<ncnn::Blob>_>::~vector(&this->blobs);
  return;
}

Assistant:

Net::~Net()
{
    clear();

#if NCNN_VULKAN
    delete cast_float32_to_float16;
    delete cast_float16_to_float32;
    delete packing_pack1;
    delete packing_pack4;
    delete packing_pack8;
#endif // NCNN_VULKAN
}